

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::GetPrototype
          (GeneratedMessageFactory *this,Descriptor *type)

{
  FileDescriptor *this_00;
  DescriptorPool *pDVar1;
  DescriptorPool *pDVar2;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>
  this_01;
  WriterMutexLock local_28;
  WriterMutexLock lock;
  Message *result;
  Descriptor *type_local;
  GeneratedMessageFactory *this_local;
  
  result = (Message *)type;
  type_local = (Descriptor *)this;
  lock.mu_ = (Mutex *)TryGetPrototype(this,type);
  if ((Message *)lock.mu_ == (Message *)0x0) {
    this_00 = Descriptor::file((Descriptor *)result);
    pDVar1 = FileDescriptor::pool(this_00);
    pDVar2 = DescriptorPool::generated_pool();
    if (pDVar1 == pDVar2) {
      lock.mu_ = (Mutex *)DynamicMessageFactory::GetPrototype
                                    (&this->dropped_defaults_factory_,(Descriptor *)result);
      absl::lts_20250127::WriterMutexLock::WriterMutexLock(&local_28,&this->mutex_);
      this_01 = absl::lts_20250127::container_internal::
                raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
                ::
                operator[]<google::protobuf::Descriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>
                          ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
                            *)&this->type_map_,
                           (key_arg<const_google::protobuf::Descriptor_*> *)&result);
      MessagePtr::set(this_01,(Message *)lock.mu_);
      absl::lts_20250127::WriterMutexLock::~WriterMutexLock(&local_28);
    }
  }
  return (Message *)lock.mu_;
}

Assistant:

const Message* GeneratedMessageFactory::GetPrototype(const Descriptor* type) {
  const Message* result = TryGetPrototype(type);
  if (result == nullptr &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    // We registered this descriptor with a null pointer.
    // In this case we need to create the prototype from the dynamic factory.
    // We _must_ do this outside the lock because the dynamic factory will call
    // back into the generated factory for cross linking.
    result = dropped_defaults_factory_.GetPrototype(type);

    {
      absl::WriterMutexLock lock(&mutex_);
      // And update the main map to make the next lookup faster.
      // We don't need to recheck here. Even if someone raced us here the result
      // is the same, so we can just write it.
      type_map_[type].set(result);
    }
  }

  return result;
}